

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O0

int dog_nutrition(monst *mtmp,obj *obj)

{
  ushort uVar1;
  int iVar2;
  uint local_1c;
  int nutrit;
  obj *obj_local;
  monst *mtmp_local;
  
  if (obj->oclass == '\a') {
    if (obj->otyp == 0x10e) {
      mtmp->meating = ((int)(uint)mons[obj->corpsenm].cwt >> 6) + 3;
      uVar1 = mons[obj->corpsenm].cnutrit;
    }
    else {
      mtmp->meating = (int)objects[obj->otyp].oc_delay;
      uVar1 = objects[obj->otyp].oc_nutrition;
    }
    local_1c = (uint)uVar1;
    switch(mtmp->data->msize) {
    case '\0':
      local_1c = local_1c << 3;
      break;
    case '\x01':
      local_1c = local_1c * 6;
      break;
    case '\x03':
      local_1c = local_1c << 2;
      break;
    case '\x04':
      local_1c = local_1c * 3;
      break;
    default:
    case '\x02':
      local_1c = local_1c * 5;
      break;
    case '\a':
      local_1c = local_1c << 1;
    }
    if (obj->oeaten != 0) {
      iVar2 = eaten_stat(mtmp->meating,obj);
      mtmp->meating = iVar2;
      local_1c = eaten_stat(local_1c,obj);
    }
  }
  else if (obj->oclass == '\f') {
    mtmp->meating = obj->quan / 2000 + 1;
    if (mtmp->meating < 0) {
      mtmp->meating = 1;
    }
    local_1c = obj->quan / 0x14;
    if ((int)local_1c < 0) {
      local_1c = 0;
    }
  }
  else {
    mtmp->meating = obj->owt / 0x14 + 1;
    local_1c = (uint)objects[obj->otyp].oc_nutrition * 5;
  }
  return local_1c;
}

Assistant:

int dog_nutrition(struct monst *mtmp, struct obj *obj)
{
	int nutrit;

	/*
	 * It is arbitrary that the pet takes the same length of time to eat
	 * as a human, but gets more nutritional value.
	 */
	if (obj->oclass == FOOD_CLASS) {
	    if (obj->otyp == CORPSE) {
		mtmp->meating = 3 + (mons[obj->corpsenm].cwt >> 6);
		nutrit = mons[obj->corpsenm].cnutrit;
	    } else {
		mtmp->meating = objects[obj->otyp].oc_delay;
		nutrit = objects[obj->otyp].oc_nutrition;
	    }
	    switch(mtmp->data->msize) {
		case MZ_TINY: nutrit *= 8; break;
		case MZ_SMALL: nutrit *= 6; break;
		default:
		case MZ_MEDIUM: nutrit *= 5; break;
		case MZ_LARGE: nutrit *= 4; break;
		case MZ_HUGE: nutrit *= 3; break;
		case MZ_GIGANTIC: nutrit *= 2; break;
	    }
	    if (obj->oeaten) {
		mtmp->meating = eaten_stat(mtmp->meating, obj);
		nutrit = eaten_stat(nutrit, obj);
	    }
	} else if (obj->oclass == COIN_CLASS) {
	    mtmp->meating = (int)(obj->quan/2000) + 1;
	    if (mtmp->meating < 0) mtmp->meating = 1;
	    nutrit = (int)(obj->quan/20);
	    if (nutrit < 0) nutrit = 0;
	} else {
	    /* Unusual pet such as gelatinous cube eating odd stuff.
	     * meating made consistent with wild monsters in mon.c.
	     * nutrit made consistent with polymorphed player nutrit in
	     * eat.c.  (This also applies to pets eating gold.)
	     */
	    mtmp->meating = obj->owt/20 + 1;
	    nutrit = 5*objects[obj->otyp].oc_nutrition;
	}
	return nutrit;
}